

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O0

void __thiscall LargeGapGrayCode::printStatistics(LargeGapGrayCode *this,int bitWidth)

{
  _Setw _Var1;
  ostream *poVar2;
  reference pvVar3;
  double dVar4;
  double gapVariance;
  int local_58;
  int local_54;
  int maxCount;
  int maxGap;
  int minCount;
  int minGap;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> runLengths;
  int bitWidth_local;
  LargeGapGrayCode *this_local;
  
  runLengths._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = bitWidth;
  computeRunLengths((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    &minCount,this,bitWidth);
  computeMinGap(this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &minCount,&maxGap,&maxCount);
  computeMaxGap(this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &minCount,&local_54,&local_58);
  dVar4 = computeGapVariance(this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&minCount);
  _Var1 = std::setw(5);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,runLengths._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->m_creationMethod,
                        (long)(runLengths._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ +
                              -1));
  poVar2 = std::operator<<(poVar2,(string *)pvVar3);
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,maxGap);
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_54);
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,maxCount);
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_58);
  _Var1 = std::setw(0xe);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&minCount
            );
  return;
}

Assistant:

void LargeGapGrayCode::printStatistics(int bitWidth)
{
	std::map<int, int> runLengths = computeRunLengths(bitWidth);
	int minGap, minCount, maxGap, maxCount;
	computeMinGap(runLengths, minGap, minCount);
	computeMaxGap(runLengths, maxGap, maxCount);
	double gapVariance = computeGapVariance(runLengths);
	std::cout 	<< std::setw(5) << bitWidth
			<< std::setw(12) << m_creationMethod[bitWidth-1]
			<< std::setw(12) << minGap
			<< std::setw(12) << maxGap
			<< std::setw(12) << minCount
			<< std::setw(12) << maxCount
			<< std::setw(14) << gapVariance << std::endl;
}